

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Deserializer::ParsePGIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,string *hostLanguage)

{
  char cVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  __ireturn_type _Var8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  stepsFound;
  ProcessGroupIndex index;
  size_t local_f0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_e8;
  string local_b0;
  ProcessGroupIndex local_90;
  
  lVar2 = *(long *)this;
  *(undefined8 *)(&this->field_0x1a0 + *(long *)(lVar2 + -0x18)) =
       *(undefined8 *)
        (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_f0 = 0x10;
  local_e8._M_buckets = &local_e8._M_single_bucket;
  local_e8._M_bucket_count = 1;
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_element_count = 0;
  local_e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8._M_rehash_policy._M_next_resize = 0;
  local_e8._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)(&this->field_0x1d0 + *(long *)(lVar2 + -0x18)) = 0;
  uVar3 = (this->m_Minifooter).VarsIndexStart;
  uVar4 = (this->m_Minifooter).PGIndexStart;
  for (uVar7 = 0; uVar7 < (uVar3 - uVar4) - 0x10; uVar7 = uVar7 + uVar6 + 2) {
    BPBase::ReadProcessGroupIndexHeader
              (&local_90,(BPBase *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),
               &bufferSTL->m_Buffer,&local_f0,(this->m_Minifooter).IsLittleEndian);
    lVar2 = *(long *)this;
    if (local_90.IsColumnMajor == 'y') {
      (&this->field_0x2f0)[*(long *)(lVar2 + -0x18)] = 0;
    }
    *(ulong *)(&this->field_0x1d8 + *(long *)(lVar2 + -0x18)) = (ulong)(local_90.Step - 1);
    _Var8 = std::__detail::
            _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&local_e8,&local_90.Step);
    if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)(&this->field_0x1d0 + *(long *)(*(long *)this + -0x18)) =
           *(long *)(&this->field_0x1d0 + *(long *)(*(long *)this + -0x18)) + 1;
    }
    uVar6 = (ulong)local_90.Length;
    BPBase::ProcessGroupIndex::~ProcessGroupIndex(&local_90);
  }
  cVar1 = (&this->field_0x2f0)[*(long *)(*(long *)this + -0x18)];
  std::__cxx11::string::string((string *)&local_b0,(string *)hostLanguage);
  bVar5 = helper::IsRowMajor(&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if ((bool)cVar1 != bVar5) {
    (&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)] = 1;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_e8);
  return;
}

Assistant:

void BP3Deserializer::ParsePGIndex(const BufferSTL &bufferSTL, const std::string hostLanguage)
{
    const auto &buffer = bufferSTL.m_Buffer;
    // always start from zero
    size_t position = 0;

    m_MetadataSet.DataPGCount =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    size_t localPosition = 0;

    std::unordered_set<uint32_t> stepsFound;
    m_MetadataSet.StepsCount = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the PG index. Let's use
     * here the more reliable limit: the start of variable index - start of
     * PG index (- the already parsed 16 bytes)
     */
    const size_t pgIndexLength = m_Minifooter.VarsIndexStart - m_Minifooter.PGIndexStart - 16;

    while (localPosition < pgIndexLength)
    {
        ProcessGroupIndex index =
            ReadProcessGroupIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);
        if (index.IsColumnMajor == 'y')
        {
            m_IsRowMajor = false;
        }

        m_MetadataSet.CurrentStep = static_cast<size_t>(index.Step - 1);

        // Count the number of unseen steps
        if (stepsFound.insert(index.Step).second)
        {
            ++m_MetadataSet.StepsCount;
        }

        localPosition += index.Length + 2;
    }

    if (m_IsRowMajor != helper::IsRowMajor(hostLanguage))
    {
        m_ReverseDimensions = true;
    }
}